

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

bool __thiscall reduceDB_lt::operator()(reduceDB_lt *this,CRef x,CRef y)

{
  uint uVar1;
  uint *puVar2;
  bool bVar3;
  uint uVar4;
  
  uVar4 = (this->ca->ra).sz;
  if (x < uVar4) {
    puVar2 = (this->ca->ra).memory;
    uVar1 = puVar2[x];
    if (uVar1 < 0x60) {
      bVar3 = false;
    }
    else {
      if (uVar4 <= y) goto LAB_0010ee65;
      uVar4 = puVar2[y] >> 5;
      bVar3 = true;
      if (uVar4 != 2) {
        if (((uVar1 & 8) == 0) || ((puVar2[y] & 8) == 0)) {
          __assert_fail("header.has_extra",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/SolverTypes.h"
                        ,0xd6,"float &Minisat::Clause::activity()");
        }
        bVar3 = (float)puVar2[(ulong)x + (ulong)(uVar1 >> 5) + 1] <=
                (float)puVar2[(ulong)y + (ulong)uVar4 + 1] &&
                (float)puVar2[(ulong)y + (ulong)uVar4 + 1] !=
                (float)puVar2[(ulong)x + (ulong)(uVar1 >> 5) + 1];
      }
    }
    return bVar3;
  }
LAB_0010ee65:
  __assert_fail("r < sz",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Alloc.h"
                ,0x3f,
                "T &Minisat::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]");
}

Assistant:

bool operator () (CRef x, CRef y) { 
        return ca[x].size() > 2 && (ca[y].size() == 2 || ca[x].activity() < ca[y].activity()); }